

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t pax_attribute_LIBARCHIVE_xattr
                  (archive_entry *entry,char *name,size_t name_length,char *value,
                  size_t value_length)

{
  byte bVar1;
  byte *name_00;
  byte *pbVar2;
  long lVar3;
  undefined1 *value_00;
  undefined1 *puVar4;
  size_t size;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  wchar_t wVar9;
  
  name_00 = (byte *)malloc(name_length + 1);
  if (name_00 == (byte *)0x0) {
    wVar9 = L'\x02';
  }
  else {
    pbVar2 = name_00;
    if (name_length != 0) {
      do {
        bVar1 = *name;
        if (bVar1 == 0) break;
        if (name_length < 3 || bVar1 != 0x25) {
LAB_0014bb88:
          name = (char *)((byte *)name + 1);
          *pbVar2 = bVar1;
          name_length = name_length - 1;
        }
        else {
          iVar5 = (int)(char)((byte *)name)[1];
          uVar6 = iVar5 - 0x30;
          if (9 < uVar6) {
            if (iVar5 - 0x41U < 6) {
              uVar6 = iVar5 - 0x37;
            }
            else {
              uVar6 = iVar5 - 0x57;
              if (5 < iVar5 - 0x61U) {
                uVar6 = 0xffffffff;
              }
            }
          }
          iVar5 = (int)(char)((byte *)name)[2];
          uVar7 = iVar5 - 0x30;
          if (9 < uVar7) {
            if (iVar5 - 0x41U < 6) {
              uVar7 = iVar5 - 0x37;
            }
            else {
              uVar7 = iVar5 - 0x57;
              if (5 < iVar5 - 0x61U) {
                uVar7 = 0xffffffff;
              }
            }
          }
          if (((int)uVar6 < 0) || ((int)uVar7 < 0)) goto LAB_0014bb88;
          name = (char *)((byte *)name + 3);
          name_length = name_length - 3;
          *pbVar2 = (byte)uVar7 | (byte)(uVar6 << 4);
        }
        pbVar2 = pbVar2 + 1;
      } while (name_length != 0);
    }
    *pbVar2 = 0;
    if (base64_decode_decode_table[0x42] != '\x01') {
      base64_decode_decode_table._112_4_ = 0xffffffff;
      base64_decode_decode_table._116_4_ = 0xffffffff;
      base64_decode_decode_table._120_4_ = 0xffffffff;
      base64_decode_decode_table._124_4_ = 0xffffffff;
      base64_decode_decode_table._96_4_ = 0xffffffff;
      base64_decode_decode_table._100_4_ = 0xffffffff;
      base64_decode_decode_table._104_4_ = 0xffffffff;
      base64_decode_decode_table._108_4_ = 0xffffffff;
      base64_decode_decode_table._80_4_ = 0xffffffff;
      base64_decode_decode_table._84_4_ = 0xffffffff;
      base64_decode_decode_table._88_4_ = 0xffffffff;
      base64_decode_decode_table._92_4_ = 0xffffffff;
      base64_decode_decode_table._64_4_ = 0xffffffff;
      base64_decode_decode_table._68_4_ = 0xffffffff;
      base64_decode_decode_table._72_4_ = 0xffffffff;
      base64_decode_decode_table._76_4_ = 0xffffffff;
      base64_decode_decode_table._48_4_ = 0xffffffff;
      base64_decode_decode_table._52_4_ = 0xffffffff;
      base64_decode_decode_table._56_4_ = 0xffffffff;
      base64_decode_decode_table._60_4_ = 0xffffffff;
      base64_decode_decode_table._32_4_ = 0xffffffff;
      base64_decode_decode_table._36_4_ = 0xffffffff;
      base64_decode_decode_table._40_4_ = 0xffffffff;
      base64_decode_decode_table._44_4_ = 0xffffffff;
      base64_decode_decode_table._16_4_ = 0xffffffff;
      base64_decode_decode_table._20_4_ = 0xffffffff;
      base64_decode_decode_table._24_4_ = 0xffffffff;
      base64_decode_decode_table._28_4_ = 0xffffffff;
      base64_decode_decode_table._0_4_ = 0xffffffff;
      base64_decode_decode_table._4_4_ = 0xffffffff;
      base64_decode_decode_table._8_4_ = 0xffffffff;
      base64_decode_decode_table._12_4_ = 0xffffffff;
      lVar3 = 0;
      do {
        base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar3]] = (char)lVar3;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x40);
    }
    value_00 = (undefined1 *)malloc((value_length - (value_length >> 2)) + 1);
    if (value_00 == (undefined1 *)0x0) {
      free(name_00);
      wVar9 = L'\x01';
    }
    else {
      wVar9 = L'\0';
      puVar4 = value_00;
      if (value_length == 0) {
        size = 0;
      }
      else {
        do {
          uVar7 = 0;
          uVar6 = 0;
          do {
            lVar3 = 1 - value_length;
            pbVar2 = (byte *)value;
LAB_0014bc59:
            bVar1 = *pbVar2;
            if ((bVar1 == 0x3d) || (bVar1 == 0x5f)) goto LAB_0014bcbd;
            if (((char)bVar1 < ' ') || ((byte)base64_decode_decode_table[bVar1] == 0xff))
            goto LAB_0014bc7d;
            uVar7 = uVar7 << 6 | (uint)(byte)base64_decode_decode_table[bVar1];
            uVar8 = uVar6 + 1;
            if (2 < uVar6) break;
            value = (char *)(pbVar2 + 1);
            value_length = -lVar3;
            uVar6 = uVar8;
          } while (lVar3 != 0);
          pbVar2 = pbVar2 + 1;
          value_length = -lVar3;
LAB_0014bcc0:
          iVar5 = uVar7 << (('\x04' - (char)uVar8) * '\x06' & 0x1fU);
          if (uVar8 == 2) {
LAB_0014bce4:
            *puVar4 = (char)((uint)iVar5 >> 0x10);
          }
          else {
            if (uVar8 == 3) {
LAB_0014bce1:
              puVar4[1] = (char)((uint)iVar5 >> 8);
              goto LAB_0014bce4;
            }
            if (uVar8 == 4) {
              puVar4[2] = (char)iVar5;
              goto LAB_0014bce1;
            }
          }
          iVar5 = uVar8 * 3 + 3;
          if (-1 < (int)(uVar8 * 3)) {
            iVar5 = uVar8 * 3;
          }
          puVar4 = puVar4 + (iVar5 >> 2);
          value = (char *)pbVar2;
        } while (value_length != 0);
        size = (long)puVar4 - (long)value_00;
      }
      archive_entry_xattr_add_entry(entry,(char *)name_00,value_00,size);
      free(name_00);
      free(value_00);
    }
  }
  return wVar9;
LAB_0014bc7d:
  pbVar2 = pbVar2 + 1;
  lVar3 = lVar3 + 1;
  if (lVar3 == 1) {
    pbVar2 = (byte *)value + value_length;
LAB_0014bcbd:
    value_length = 0;
    uVar8 = uVar6;
    goto LAB_0014bcc0;
  }
  goto LAB_0014bc59;
}

Assistant:

static int
pax_attribute_LIBARCHIVE_xattr(struct archive_entry *entry,
	const char *name, size_t name_length, const char *value, size_t value_length)
{
	char *name_decoded;
	void *value_decoded;
	size_t value_len;

	if (name_length < 1)
		return 3;

	/* URL-decode name */
	name_decoded = url_decode(name, name_length);
	if (name_decoded == NULL)
		return 2;

	/* Base-64 decode value */
	value_decoded = base64_decode(value, value_length, &value_len);
	if (value_decoded == NULL) {
		free(name_decoded);
		return 1;
	}

	archive_entry_xattr_add_entry(entry, name_decoded,
		value_decoded, value_len);

	free(name_decoded);
	free(value_decoded);
	return 0;
}